

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O1

void __thiscall
S2CrossingEdgeQuery::GetCrossingEdges
          (S2CrossingEdgeQuery *this,S2Point *a0,S2Point *a1,S2Shape *shape,CrossingType type,
          vector<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_> *edges)

{
  pointer *ppSVar1;
  uint uVar2;
  pointer pSVar3;
  pointer pSVar4;
  iterator __position;
  ShapeEdgeId SVar5;
  int iVar6;
  int edge_id;
  pointer pSVar7;
  Edge b;
  S2CopyingEdgeCrosser crosser;
  ShapeEdge local_150;
  S2Point local_118;
  S2Point SStack_100;
  S2CopyingEdgeCrosser local_e8;
  
  pSVar3 = (edges->
           super__Vector_base<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((edges->super__Vector_base<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>).
      _M_impl.super__Vector_impl_data._M_finish != pSVar3) {
    (edges->super__Vector_base<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>).
    _M_impl.super__Vector_impl_data._M_finish = pSVar3;
  }
  GetCandidates(this,a0,a1,shape,&this->tmp_candidates_);
  local_e8.a_.c_[2] = a0->c_[2];
  local_e8.a_.c_[0] = a0->c_[0];
  local_e8.a_.c_[1] = a0->c_[1];
  local_e8.b_.c_[0] = a1->c_[0];
  local_e8.b_.c_[1] = a1->c_[1];
  local_e8.b_.c_[2] = a1->c_[2];
  local_e8.c_.c_[0] = 0.0;
  local_e8.c_.c_[1] = 0.0;
  local_e8.c_.c_[2] = 0.0;
  S2EdgeCrosser::S2EdgeCrosser(&local_e8.crosser_,&local_e8.a_,&local_e8.b_);
  pSVar7 = (this->tmp_candidates_).
           super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (this->tmp_candidates_).
           super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar7 != pSVar4) {
    do {
      uVar2 = pSVar7->edge_id;
      (*shape->_vptr_S2Shape[3])(&local_118,shape,(ulong)uVar2);
      iVar6 = S2CopyingEdgeCrosser::CrossingSign(&local_e8,&local_118,&SStack_100);
      if ((int)(uint)(type != ALL) <= iVar6) {
        local_150.id_.shape_id = shape->id_;
        local_150.edge_.v1.c_[1] = SStack_100.c_[1];
        local_150.edge_.v1.c_[2] = SStack_100.c_[2];
        local_150.edge_.v0.c_[2] = local_118.c_[2];
        local_150.edge_.v1.c_[0] = SStack_100.c_[0];
        local_150.edge_.v0.c_[0] = local_118.c_[0];
        local_150.edge_.v0.c_[1] = local_118.c_[1];
        __position._M_current =
             (edges->
             super__Vector_base<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        local_150.id_.edge_id = uVar2;
        if (__position._M_current ==
            (edges->
            super__Vector_base<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>::
          _M_realloc_insert<s2shapeutil::ShapeEdge>(edges,__position,&local_150);
        }
        else {
          ((__position._M_current)->edge_).v1.c_[2] = SStack_100.c_[2];
          SVar5.edge_id = uVar2;
          SVar5.shape_id = local_150.id_.shape_id;
          ((__position._M_current)->edge_).v1.c_[0] = SStack_100.c_[0];
          ((__position._M_current)->edge_).v1.c_[1] = SStack_100.c_[1];
          ((__position._M_current)->edge_).v0.c_[1] = local_118.c_[1];
          ((__position._M_current)->edge_).v0.c_[2] = local_118.c_[2];
          (__position._M_current)->id_ = SVar5;
          ((__position._M_current)->edge_).v0.c_[0] = local_118.c_[0];
          ppSVar1 = &(edges->
                     super__Vector_base<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
      }
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != pSVar4);
  }
  return;
}

Assistant:

void S2CrossingEdgeQuery::GetCrossingEdges(
    const S2Point& a0, const S2Point& a1, const S2Shape& shape,
    CrossingType type, vector<ShapeEdge>* edges) {
  edges->clear();
  GetCandidates(a0, a1, shape, &tmp_candidates_);
  int min_sign = (type == CrossingType::ALL) ? 0 : 1;
  S2CopyingEdgeCrosser crosser(a0, a1);
  for (ShapeEdgeId candidate : tmp_candidates_) {
    int edge_id = candidate.edge_id;
    S2Shape::Edge b = shape.edge(edge_id);
    if (crosser.CrossingSign(b.v0, b.v1) >= min_sign) {
      edges->push_back(ShapeEdge(shape.id(), edge_id, b));
    }
  }
}